

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O0

size_t split_fields(char *text,char *sep,char ***fields)

{
  size_t sVar1;
  char *__dest;
  void *__ptr;
  void *pvVar2;
  char **ppcVar3;
  char *local_50;
  size_t n_field;
  size_t result;
  char **work;
  char *token;
  char *buf;
  char ***fields_local;
  char *sep_local;
  char *text_local;
  
  local_50 = (char *)0x0;
  sVar1 = strlen(text);
  __dest = (char *)calloc(sVar1 + 1,1);
  strcpy(__dest,text);
  work = (char **)strtok(__dest,sep);
  if (work == (char **)0x0) {
    text_local = (char *)0x0;
  }
  else {
    __ptr = calloc(0x400,8);
    while (work != (char **)0x0) {
      sVar1 = strlen((char *)work);
      pvVar2 = calloc(sVar1 + 1,8);
      *(void **)((long)__ptr + (long)local_50 * 8) = pvVar2;
      strcpy(*(char **)((long)__ptr + (long)local_50 * 8),(char *)work);
      local_50 = local_50 + 1;
      work = (char **)strtok((char *)0x0,sep);
    }
    free(__dest);
    ppcVar3 = (char **)realloc(__ptr,(long)local_50 << 3);
    *fields = ppcVar3;
    text_local = local_50;
  }
  return (size_t)text_local;
}

Assistant:

size_t 
split_fields(const char* text, const char* sep, char*** fields) 
{
	char*  buf    = (char*)NULL;
	char*  token  = (char*)NULL;
	char**  work  = (char**)NULL;
	size_t result = 0;
	size_t n_field = 0;
	
	buf = (char*)calloc(strlen(text) + 1, sizeof(char));
	strcpy(buf, text);
	
	token = strtok(buf, sep);
    /* TODO if separator not found, leave */
    if (!token) {
		/* TODO report reading problem */
        return 0;
	}
	// printf("1st token '%s'\n", token);
	
	work = (char**)calloc(1024, sizeof(char*));

    /* TODO get all elements */
	while (token) {
		work[n_field] = 
			(char*)calloc(strlen(token) + 1, sizeof(char*));
		strcpy(work[n_field], token);
		
		n_field++;
		token = strtok(NULL, sep);
		// printf("token %ld '%s'\n", n_field, token);
	}

	result = n_field;
	
	free(buf);
	work = (char**)realloc(work, result * sizeof(char*));
	
	*fields = work;
	
	/* Normal function termination */
	return result;
}